

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

int __thiscall
LPCMStreamReader::getTSDescriptor
          (LPCMStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int sampling_frequency;
  int audio_presentation_type;
  uint8_t *curPos;
  int local_38;
  int len;
  int skipBeforeBytes;
  int skipBytes;
  uint8_t *frame;
  bool hdmvDescriptors_local;
  uint8_t *puStack_20;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  LPCMStreamReader *this_local;
  
  frame._6_1_ = hdmvDescriptors;
  frame._7_1_ = blurayMode;
  puStack_20 = dstBuff;
  dstBuff_local = (uint8_t *)this;
  if ((this->m_headerType != htNone) ||
     (bVar1 = detectLPCMType(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                  m_buffer,
                             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_bufEnd -
                             (long)(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                                   m_buffer), bVar1)) {
    _skipBeforeBytes =
         findFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer,
                   (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
    if (_skipBeforeBytes == (uint8_t *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      len = 0;
      local_38 = 0;
      iVar4 = decodeFrame(this,_skipBeforeBytes,
                          (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
                          &len,&local_38);
      if (iVar4 < 1) {
        this_local._4_4_ = 0;
      }
      else {
        *puStack_20 = '\x05';
        puStack_20[1] = '\b';
        puStack_20[2] = 'H';
        puStack_20[3] = 'D';
        puStack_20[4] = 'M';
        puStack_20[5] = 'V';
        puStack_20[6] = 0xff;
        puStack_20[7] = 0x80;
        if (this->m_channels < 3) {
          cVar2 = '\x01';
          if (this->m_channels == '\x02') {
            cVar2 = '\x03';
          }
        }
        else {
          cVar2 = '\x06';
        }
        if (this->m_freq == 0x2ee00) {
          bVar3 = 5;
        }
        else {
          bVar3 = 1;
          if (this->m_freq == 96000) {
            bVar3 = 4;
          }
        }
        puStack_20[8] = cVar2 << 4 | bVar3;
        this_local._4_4_ = 10;
        puStack_20[9] = ((char)this->m_bitsPerSample + -0xc) * '\x10' | 0x3f;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int LPCMStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, bool hdmvDescriptors)
{
    if (m_headerType == LPCMHeaderType::htNone)
        if (!detectLPCMType(m_buffer, m_bufEnd - m_buffer))
            return 0;
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    const int len = decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
    if (len < 1)
        return 0;

    // Blu-ray core specifications Table 9-11 - HDMV LPCM audio registration descriptor
    uint8_t* curPos = dstBuff;
    *curPos++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);  // descriptor tag
    *curPos++ = 8;                                                    // descriptor length
    *curPos++ = 'H';
    *curPos++ = 'D';
    *curPos++ = 'M';
    *curPos++ = 'V';
    *curPos++ = 0xff;  // stuffing_bits

    *curPos++ = static_cast<uint8_t>(TSDescriptorTag::LPCM);  // descriptor tag
    const int audio_presentation_type = (m_channels > 2) ? 6 : (m_channels == 2) ? 3 : 1;
    const int sampling_frequency = (m_freq == 192000) ? 5 : (m_freq == 96000) ? 4 : 1;
    *curPos++ = static_cast<uint8_t>(audio_presentation_type << 4 | sampling_frequency);
    *curPos++ = static_cast<uint8_t>((m_bitsPerSample - 12) << 4 | 0x3f);  // bits_per_sample (2 bits), stuffing_bits

    return static_cast<int>(curPos - dstBuff);
}